

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  size_t k;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  uint uVar42;
  int iVar43;
  long lVar44;
  ulong uVar45;
  undefined1 (*pauVar46) [32];
  ulong uVar47;
  uint uVar48;
  ulong *puVar49;
  ulong uVar50;
  undefined4 uVar51;
  ulong unaff_R15;
  bool bVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [36];
  float fVar73;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [36];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar103 [32];
  uint uVar100;
  uint uVar105;
  uint uVar106;
  uint uVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [64];
  undefined1 auVar111 [32];
  uint uVar113;
  uint uVar114;
  undefined1 auVar112 [64];
  undefined1 auVar115 [32];
  undefined1 auVar117 [36];
  undefined1 auVar116 [64];
  undefined1 auVar118 [32];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5ea1;
  undefined1 local_5ea0 [48];
  Geometry *local_5e70;
  RayK<8> *local_5e68;
  undefined1 local_5e60 [32];
  undefined1 local_5e40 [40];
  undefined1 (*local_5e18) [32];
  RTCFilterFunctionNArguments local_5e10;
  undefined1 local_5de0 [32];
  long local_5da8;
  undefined1 local_5da0 [8];
  float fStack_5d98;
  float fStack_5d94;
  float fStack_5d90;
  float fStack_5d8c;
  float fStack_5d88;
  float fStack_5d84;
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined4 local_5d40;
  undefined4 uStack_5d3c;
  undefined4 uStack_5d38;
  undefined4 uStack_5d34;
  undefined4 uStack_5d30;
  undefined4 uStack_5d2c;
  undefined4 uStack_5d28;
  undefined4 uStack_5d24;
  undefined8 local_5d10;
  undefined8 uStack_5d08;
  undefined1 local_5d00 [32];
  undefined1 local_5ce0 [8];
  float fStack_5cd8;
  float fStack_5cd4;
  float fStack_5cd0;
  float fStack_5ccc;
  float fStack_5cc8;
  float fStack_5cc4;
  float local_5cc0;
  float fStack_5cbc;
  float fStack_5cb8;
  float fStack_5cb4;
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  undefined4 uStack_5ca4;
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  RTCHitN local_5c60 [32];
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  uint local_5b80;
  uint uStack_5b7c;
  uint uStack_5b78;
  uint uStack_5b74;
  uint uStack_5b70;
  uint uStack_5b6c;
  uint uStack_5b68;
  uint uStack_5b64;
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  float local_5ac0;
  float fStack_5abc;
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  float fStack_5aa4;
  float local_5aa0;
  float fStack_5a9c;
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  float fStack_5a84;
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  float fStack_5a64;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  local_5808 = (bvh->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar69 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar58 = ZEXT816(0) << 0x40;
      auVar56 = vpcmpeqd_avx2(auVar69,(undefined1  [32])valid_i->field_0);
      auVar69 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar58),5);
      auVar59 = auVar56 & auVar69;
      if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar59 >> 0x7f,0) != '\0') ||
            (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar59 >> 0xbf,0) != '\0') ||
          (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar59[0x1f] < '\0') {
        auVar69 = vandps_avx(auVar69,auVar56);
        local_5a40._0_4_ = *(float *)ray;
        local_5a40._4_4_ = *(float *)(ray + 4);
        local_5a40._8_4_ = *(float *)(ray + 8);
        local_5a40._12_4_ = *(float *)(ray + 0xc);
        local_5a40._16_4_ = *(float *)(ray + 0x10);
        local_5a40._20_4_ = *(float *)(ray + 0x14);
        local_5a40._24_4_ = *(float *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(float *)(ray + 0x20);
        local_5a40._36_4_ = *(float *)(ray + 0x24);
        local_5a40._40_4_ = *(float *)(ray + 0x28);
        local_5a40._44_4_ = *(float *)(ray + 0x2c);
        local_5a40._48_4_ = *(float *)(ray + 0x30);
        local_5a40._52_4_ = *(float *)(ray + 0x34);
        local_5a40._56_4_ = *(float *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(float *)(ray + 0x40);
        local_5a40._68_4_ = *(float *)(ray + 0x44);
        local_5a40._72_4_ = *(float *)(ray + 0x48);
        local_5a40._76_4_ = *(float *)(ray + 0x4c);
        local_5a40._80_4_ = *(float *)(ray + 0x50);
        local_5a40._84_4_ = *(float *)(ray + 0x54);
        local_5a40._88_4_ = *(float *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_5ca0._8_4_ = 0x7fffffff;
        local_5ca0._0_8_ = 0x7fffffff7fffffff;
        local_5ca0._12_4_ = 0x7fffffff;
        local_5ca0._16_4_ = 0x7fffffff;
        local_5ca0._20_4_ = 0x7fffffff;
        local_5ca0._24_4_ = 0x7fffffff;
        local_5ca0._28_4_ = 0x7fffffff;
        auVar101._8_4_ = 0x219392ef;
        auVar101._0_8_ = 0x219392ef219392ef;
        auVar101._12_4_ = 0x219392ef;
        auVar101._16_4_ = 0x219392ef;
        auVar101._20_4_ = 0x219392ef;
        auVar101._24_4_ = 0x219392ef;
        auVar101._28_4_ = 0x219392ef;
        auVar59 = vandps_avx(local_5ca0,local_59e0);
        auVar59 = vcmpps_avx(auVar59,auVar101,1);
        auVar56 = vblendvps_avx(local_59e0,auVar101,auVar59);
        auVar59 = vandps_avx(local_5ca0,local_59c0);
        auVar59 = vcmpps_avx(auVar59,auVar101,1);
        auVar74 = vblendvps_avx(local_59c0,auVar101,auVar59);
        auVar59 = vandps_avx(local_59a0,local_5ca0);
        auVar59 = vcmpps_avx(auVar59,auVar101,1);
        auVar59 = vblendvps_avx(local_59a0,auVar101,auVar59);
        auVar5 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
        auVar69 = vrcpps_avx(auVar56);
        auVar102._8_4_ = 0x3f800000;
        auVar102._0_8_ = 0x3f8000003f800000;
        auVar102._12_4_ = 0x3f800000;
        auVar102._16_4_ = 0x3f800000;
        auVar102._20_4_ = 0x3f800000;
        auVar102._24_4_ = 0x3f800000;
        auVar102._28_4_ = 0x3f800000;
        auVar11 = vfnmadd213ps_fma(auVar56,auVar69,auVar102);
        auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar69,auVar69);
        auVar69 = vrcpps_avx(auVar74);
        auVar12 = vfnmadd213ps_fma(auVar74,auVar69,auVar102);
        auVar56 = vrcpps_avx(auVar59);
        auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar69,auVar69);
        auVar13 = vfnmadd213ps_fma(auVar59,auVar56,auVar102);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar56,auVar56);
        local_5980 = ZEXT1632(auVar11);
        local_5960 = ZEXT1632(auVar12);
        local_5940 = ZEXT1632(auVar13);
        local_5920 = auVar11._0_4_ * *(float *)ray;
        fStack_591c = auVar11._4_4_ * *(float *)(ray + 4);
        fStack_5918 = auVar11._8_4_ * *(float *)(ray + 8);
        fStack_5914 = auVar11._12_4_ * *(float *)(ray + 0xc);
        fStack_5910 = *(float *)(ray + 0x10) * 0.0;
        fStack_590c = *(float *)(ray + 0x14) * 0.0;
        fStack_5908 = *(float *)(ray + 0x18) * 0.0;
        uStack_5904 = *(undefined4 *)(ray + 0x1c);
        local_5900 = *(float *)(ray + 0x20) * auVar12._0_4_;
        fStack_58fc = *(float *)(ray + 0x24) * auVar12._4_4_;
        fStack_58f8 = *(float *)(ray + 0x28) * auVar12._8_4_;
        fStack_58f4 = *(float *)(ray + 0x2c) * auVar12._12_4_;
        fStack_58f0 = *(float *)(ray + 0x30) * 0.0;
        fStack_58ec = *(float *)(ray + 0x34) * 0.0;
        fStack_58e8 = *(float *)(ray + 0x38) * 0.0;
        uStack_58e4 = *(undefined4 *)(ray + 0x3c);
        local_58e0 = *(float *)(ray + 0x40) * auVar13._0_4_;
        fStack_58dc = *(float *)(ray + 0x44) * auVar13._4_4_;
        fStack_58d8 = *(float *)(ray + 0x48) * auVar13._8_4_;
        fStack_58d4 = *(float *)(ray + 0x4c) * auVar13._12_4_;
        fStack_58d0 = *(float *)(ray + 0x50) * 0.0;
        fStack_58cc = *(float *)(ray + 0x54) * 0.0;
        fStack_58c8 = *(float *)(ray + 0x58) * 0.0;
        uStack_58c4 = *(undefined4 *)(ray + 0x5c);
        auVar69 = vcmpps_avx(ZEXT1632(auVar11),ZEXT1632(auVar58),1);
        auVar56._8_4_ = 0x20;
        auVar56._0_8_ = 0x2000000020;
        auVar56._12_4_ = 0x20;
        auVar56._16_4_ = 0x20;
        auVar56._20_4_ = 0x20;
        auVar56._24_4_ = 0x20;
        auVar56._28_4_ = 0x20;
        local_58c0 = vandps_avx(auVar69,auVar56);
        auVar59 = ZEXT1632(auVar58);
        auVar69 = vcmpps_avx(ZEXT1632(auVar12),auVar59,5);
        auVar74._8_4_ = 0x40;
        auVar74._0_8_ = 0x4000000040;
        auVar74._12_4_ = 0x40;
        auVar74._16_4_ = 0x40;
        auVar74._20_4_ = 0x40;
        auVar74._24_4_ = 0x40;
        auVar74._28_4_ = 0x40;
        auVar80._8_4_ = 0x60;
        auVar80._0_8_ = 0x6000000060;
        auVar80._12_4_ = 0x60;
        auVar80._16_4_ = 0x60;
        auVar80._20_4_ = 0x60;
        auVar80._24_4_ = 0x60;
        auVar80._28_4_ = 0x60;
        local_58a0 = vblendvps_avx(auVar80,auVar74,auVar69);
        auVar69 = vcmpps_avx(ZEXT1632(auVar13),auVar59,5);
        auVar75._8_4_ = 0x80;
        auVar75._0_8_ = 0x8000000080;
        auVar75._12_4_ = 0x80;
        auVar75._16_4_ = 0x80;
        auVar75._20_4_ = 0x80;
        auVar75._24_4_ = 0x80;
        auVar75._28_4_ = 0x80;
        auVar81._8_4_ = 0xa0;
        auVar81._0_8_ = 0xa0000000a0;
        auVar81._12_4_ = 0xa0;
        auVar81._16_4_ = 0xa0;
        auVar81._20_4_ = 0xa0;
        auVar81._24_4_ = 0xa0;
        auVar81._28_4_ = 0xa0;
        local_5880 = vblendvps_avx(auVar81,auVar75,auVar69);
        auVar69 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar59);
        local_5b00 = vpmovsxwd_avx2(auVar5);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar104 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar69,local_5b00);
        auVar69 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar59);
        auVar59._8_4_ = 0xff800000;
        auVar59._0_8_ = 0xff800000ff800000;
        auVar59._12_4_ = 0xff800000;
        auVar59._16_4_ = 0xff800000;
        auVar59._20_4_ = 0xff800000;
        auVar59._24_4_ = 0xff800000;
        auVar59._28_4_ = 0xff800000;
        local_5840 = vblendvps_avx(auVar59,auVar69,local_5b00);
        auVar58 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
        local_5d60 = vpmovsxwd_avx2(auVar5 ^ auVar58);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar48 = 7;
        }
        else {
          uVar48 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5e68 = ray + 0x100;
        puVar49 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar46 = (undefined1 (*) [32])local_4640;
        local_5b20 = mm_lookupmask_ps._16_8_;
        uStack_5b18 = mm_lookupmask_ps._24_8_;
        uStack_5b10 = mm_lookupmask_ps._16_8_;
        uStack_5b08 = mm_lookupmask_ps._24_8_;
        local_4660 = local_5860;
        local_5b40 = mm_lookupmask_pd._0_8_;
        uStack_5b38 = mm_lookupmask_pd._8_8_;
        uStack_5b30 = mm_lookupmask_pd._0_8_;
        uStack_5b28 = mm_lookupmask_pd._8_8_;
        local_5e18 = (undefined1 (*) [32])&local_5b80;
        auVar69 = vpcmpeqd_avx2(local_5ca0,local_5ca0);
        auVar112 = ZEXT3264(auVar69);
LAB_00603b6c:
        do {
          do {
            root.ptr = puVar49[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_00604a7d;
            puVar49 = puVar49 + -1;
            pauVar46 = pauVar46 + -1;
            local_5d80 = *pauVar46;
            auVar69 = vcmpps_avx(local_5d80,local_5840,1);
          } while ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar69 >> 0x7f,0) == '\0') &&
                     (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar69 >> 0xbf,0) == '\0') &&
                   (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar69[0x1f]);
          uVar51 = vmovmskps_avx(auVar69);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar51);
          if (uVar48 < (uint)POPCOUNT(uVar51)) {
LAB_00603baa:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_00604a7d;
                auVar69 = vcmpps_avx(local_5840,local_5d80,6);
                if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar69 >> 0x7f,0) == '\0') &&
                      (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar69 >> 0xbf,0) == '\0') &&
                    (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar69[0x1f]) goto LAB_00603b6c;
                uVar45 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar57 = local_5d60;
                if (uVar45 == 0) goto LAB_0060495a;
                auVar60._0_4_ = auVar112._0_4_ ^ local_5d60._0_4_;
                auVar60._4_4_ = auVar112._4_4_ ^ local_5d60._4_4_;
                auVar60._8_4_ = auVar112._8_4_ ^ local_5d60._8_4_;
                auVar60._12_4_ = auVar112._12_4_ ^ local_5d60._12_4_;
                auVar60._16_4_ = auVar112._16_4_ ^ local_5d60._16_4_;
                auVar60._20_4_ = auVar112._20_4_ ^ local_5d60._20_4_;
                auVar60._24_4_ = auVar112._24_4_ ^ local_5d60._24_4_;
                auVar60._28_4_ = auVar112._28_4_ ^ local_5d60._28_4_;
                unaff_R15 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar47 = 0;
                goto LAB_00603d77;
              }
              lVar44 = 0;
              uVar45 = 8;
              local_5d80 = auVar104._0_32_;
              do {
                uVar47 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar44 * 8);
                if (uVar47 == 8) break;
                uVar51 = *(undefined4 *)(root.ptr + 0x40 + lVar44 * 4);
                auVar66._4_4_ = uVar51;
                auVar66._0_4_ = uVar51;
                auVar66._8_4_ = uVar51;
                auVar66._12_4_ = uVar51;
                auVar66._16_4_ = uVar51;
                auVar66._20_4_ = uVar51;
                auVar66._24_4_ = uVar51;
                auVar66._28_4_ = uVar51;
                auVar39._4_4_ = fStack_591c;
                auVar39._0_4_ = local_5920;
                auVar39._8_4_ = fStack_5918;
                auVar39._12_4_ = fStack_5914;
                auVar39._16_4_ = fStack_5910;
                auVar39._20_4_ = fStack_590c;
                auVar39._24_4_ = fStack_5908;
                auVar39._28_4_ = uStack_5904;
                uVar51 = *(undefined4 *)(root.ptr + 0x80 + lVar44 * 4);
                auVar86._4_4_ = uVar51;
                auVar86._0_4_ = uVar51;
                auVar86._8_4_ = uVar51;
                auVar86._12_4_ = uVar51;
                auVar86._16_4_ = uVar51;
                auVar86._20_4_ = uVar51;
                auVar86._24_4_ = uVar51;
                auVar86._28_4_ = uVar51;
                auVar58 = vfmsub213ps_fma(auVar66,local_5980,auVar39);
                auVar40._4_4_ = fStack_58fc;
                auVar40._0_4_ = local_5900;
                auVar40._8_4_ = fStack_58f8;
                auVar40._12_4_ = fStack_58f4;
                auVar40._16_4_ = fStack_58f0;
                auVar40._20_4_ = fStack_58ec;
                auVar40._24_4_ = fStack_58e8;
                auVar40._28_4_ = uStack_58e4;
                uVar51 = *(undefined4 *)(root.ptr + 0xc0 + lVar44 * 4);
                auVar94._4_4_ = uVar51;
                auVar94._0_4_ = uVar51;
                auVar94._8_4_ = uVar51;
                auVar94._12_4_ = uVar51;
                auVar94._16_4_ = uVar51;
                auVar94._20_4_ = uVar51;
                auVar94._24_4_ = uVar51;
                auVar94._28_4_ = uVar51;
                auVar5 = vfmsub213ps_fma(auVar86,local_5960,auVar40);
                auVar41._4_4_ = fStack_58dc;
                auVar41._0_4_ = local_58e0;
                auVar41._8_4_ = fStack_58d8;
                auVar41._12_4_ = fStack_58d4;
                auVar41._16_4_ = fStack_58d0;
                auVar41._20_4_ = fStack_58cc;
                auVar41._24_4_ = fStack_58c8;
                auVar41._28_4_ = uStack_58c4;
                uVar51 = *(undefined4 *)(root.ptr + 0x60 + lVar44 * 4);
                auVar99._4_4_ = uVar51;
                auVar99._0_4_ = uVar51;
                auVar99._8_4_ = uVar51;
                auVar99._12_4_ = uVar51;
                auVar99._16_4_ = uVar51;
                auVar99._20_4_ = uVar51;
                auVar99._24_4_ = uVar51;
                auVar99._28_4_ = uVar51;
                auVar11 = vfmsub213ps_fma(auVar94,local_5940,auVar41);
                auVar12 = vfmsub213ps_fma(auVar99,local_5980,auVar39);
                uVar51 = *(undefined4 *)(root.ptr + 0xa0 + lVar44 * 4);
                auVar82._4_4_ = uVar51;
                auVar82._0_4_ = uVar51;
                auVar82._8_4_ = uVar51;
                auVar82._12_4_ = uVar51;
                auVar82._16_4_ = uVar51;
                auVar82._20_4_ = uVar51;
                auVar82._24_4_ = uVar51;
                auVar82._28_4_ = uVar51;
                auVar13 = vfmsub213ps_fma(auVar82,local_5960,auVar40);
                uVar51 = *(undefined4 *)(root.ptr + 0xe0 + lVar44 * 4);
                auVar70._4_4_ = uVar51;
                auVar70._0_4_ = uVar51;
                auVar70._8_4_ = uVar51;
                auVar70._12_4_ = uVar51;
                auVar70._16_4_ = uVar51;
                auVar70._20_4_ = uVar51;
                auVar70._24_4_ = uVar51;
                auVar70._28_4_ = uVar51;
                auVar8 = vfmsub213ps_fma(auVar70,local_5940,auVar41);
                auVar69 = vpminsd_avx2(ZEXT1632(auVar58),ZEXT1632(auVar12));
                auVar59 = vpminsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar13));
                auVar69 = vpmaxsd_avx2(auVar69,auVar59);
                auVar59 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar8));
                auVar56 = vpmaxsd_avx2(auVar69,auVar59);
                auVar69 = vpmaxsd_avx2(ZEXT1632(auVar58),ZEXT1632(auVar12));
                auVar59 = vpmaxsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar13));
                auVar59 = vpminsd_avx2(auVar69,auVar59);
                auVar69 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar8));
                auVar59 = vpminsd_avx2(auVar59,auVar69);
                auVar69 = vpmaxsd_avx2(auVar56,local_5860);
                auVar59 = vpminsd_avx2(auVar59,local_5840);
                auVar59 = vcmpps_avx(auVar69,auVar59,2);
                uVar50 = uVar45;
                auVar69 = local_5d80;
                if (((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar59 >> 0x7f,0) != '\0') ||
                       (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar59 >> 0xbf,0) != '\0') ||
                     (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar59[0x1f] < '\0') &&
                   (auVar69 = vblendvps_avx(auVar104._0_32_,auVar56,auVar59), uVar50 = uVar47,
                   uVar45 != 8)) {
                  *puVar49 = uVar45;
                  puVar49 = puVar49 + 1;
                  *pauVar46 = local_5d80;
                  pauVar46 = pauVar46 + 1;
                }
                local_5d80 = auVar69;
                uVar45 = uVar50;
                lVar44 = lVar44 + 1;
              } while (lVar44 != 8);
              if (uVar45 == 8) goto LAB_00604945;
              auVar69 = vcmpps_avx(local_5840,local_5d80,6);
              uVar51 = vmovmskps_avx(auVar69);
              root.ptr = uVar45;
            } while ((byte)uVar48 < (byte)POPCOUNT(uVar51));
            *puVar49 = uVar45;
            puVar49 = puVar49 + 1;
            *pauVar46 = local_5d80;
            pauVar46 = pauVar46 + 1;
LAB_00604945:
            iVar43 = 4;
          }
          else {
            while (unaff_R15 != 0) {
              k = 0;
              for (uVar45 = unaff_R15; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              local_5ea0._0_8_ = k;
              auVar69 = ZEXT1632(auVar112._0_16_);
              bVar52 = occluded1(This,bvh,root,k,&local_5ea1,ray,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,context);
              if (bVar52) {
                *(undefined4 *)(local_5d60 + local_5ea0._0_8_ * 4) = 0xffffffff;
              }
              unaff_R15 = unaff_R15 - 1 & unaff_R15;
              auVar104 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar69 = vpcmpeqd_avx2(auVar69,auVar69);
              auVar112 = ZEXT3264(auVar69);
            }
            auVar69 = auVar112._0_32_ & ~local_5d60;
            iVar43 = 3;
            if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar69 >> 0x7f,0) != '\0') ||
                  (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar69 >> 0xbf,0) != '\0') ||
                (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar69[0x1f] < '\0') {
              auVar69._8_4_ = 0xff800000;
              auVar69._0_8_ = 0xff800000ff800000;
              auVar69._12_4_ = 0xff800000;
              auVar69._16_4_ = 0xff800000;
              auVar69._20_4_ = 0xff800000;
              auVar69._24_4_ = 0xff800000;
              auVar69._28_4_ = 0xff800000;
              local_5840 = vblendvps_avx(local_5840,auVar69,local_5d60);
              iVar43 = 2;
            }
            unaff_R15 = 0;
            if (uVar48 < (uint)POPCOUNT(uVar51)) goto LAB_00603baa;
          }
        } while (iVar43 != 3);
LAB_00604a7d:
        auVar69 = vandps_avx(local_5b00,local_5d60);
        auVar65._8_4_ = 0xff800000;
        auVar65._0_8_ = 0xff800000ff800000;
        auVar65._12_4_ = 0xff800000;
        auVar65._16_4_ = 0xff800000;
        auVar65._20_4_ = 0xff800000;
        auVar65._24_4_ = 0xff800000;
        auVar65._28_4_ = 0xff800000;
        auVar69 = vmaskmovps_avx(auVar69,auVar65);
        *(undefined1 (*) [32])local_5e68 = auVar69;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar47 = uVar47 + 1;
    unaff_R15 = unaff_R15 + 0xe0;
    if (uVar45 <= uVar47) break;
LAB_00603d77:
    local_5da8 = uVar47 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    local_5c80 = auVar60;
    uVar50 = 0;
    auVar69 = auVar60;
    while( true ) {
      uVar100 = *(uint *)(unaff_R15 + uVar50 * 4);
      if ((ulong)uVar100 == 0xffffffff) break;
      fVar108 = *(float *)((unaff_R15 - 0xc0) + uVar50 * 4);
      auVar83._4_4_ = fVar108;
      auVar83._0_4_ = fVar108;
      auVar83._8_4_ = fVar108;
      auVar83._12_4_ = fVar108;
      auVar83._16_4_ = fVar108;
      auVar83._20_4_ = fVar108;
      auVar83._24_4_ = fVar108;
      auVar83._28_4_ = fVar108;
      fVar109 = *(float *)((unaff_R15 - 0xb0) + uVar50 * 4);
      auVar90._4_4_ = fVar109;
      auVar90._0_4_ = fVar109;
      auVar90._8_4_ = fVar109;
      auVar90._12_4_ = fVar109;
      auVar90._16_4_ = fVar109;
      auVar90._20_4_ = fVar109;
      auVar90._24_4_ = fVar109;
      auVar90._28_4_ = fVar109;
      fVar110 = *(float *)((unaff_R15 - 0xa0) + uVar50 * 4);
      auVar95._4_4_ = fVar110;
      auVar95._0_4_ = fVar110;
      auVar95._8_4_ = fVar110;
      auVar95._12_4_ = fVar110;
      auVar95._16_4_ = fVar110;
      auVar95._20_4_ = fVar110;
      auVar95._24_4_ = fVar110;
      auVar95._28_4_ = fVar110;
      local_5da0._4_4_ = *(float *)((unaff_R15 - 0x90) + uVar50 * 4);
      local_5ce0._4_4_ = *(float *)((unaff_R15 - 0x80) + uVar50 * 4);
      local_5a60 = *(float *)((unaff_R15 - 0x70) + uVar50 * 4);
      local_5d80._4_4_ = *(undefined4 *)((unaff_R15 - 0x60) + uVar50 * 4);
      local_5d80._0_4_ = local_5d80._4_4_;
      local_5d80._8_4_ = local_5d80._4_4_;
      local_5d80._12_4_ = local_5d80._4_4_;
      local_5d80._16_4_ = local_5d80._4_4_;
      local_5d80._20_4_ = local_5d80._4_4_;
      local_5d80._24_4_ = local_5d80._4_4_;
      local_5d80._28_4_ = local_5d80._4_4_;
      local_5d00._4_4_ = *(undefined4 *)((unaff_R15 - 0x50) + uVar50 * 4);
      local_5d00._0_4_ = local_5d00._4_4_;
      local_5d00._8_4_ = local_5d00._4_4_;
      local_5d00._12_4_ = local_5d00._4_4_;
      local_5d00._16_4_ = local_5d00._4_4_;
      local_5d00._20_4_ = local_5d00._4_4_;
      local_5d00._24_4_ = local_5d00._4_4_;
      local_5d00._28_4_ = local_5d00._4_4_;
      local_5d40 = *(undefined4 *)((unaff_R15 - 0x40) + uVar50 * 4);
      local_5a80 = *(float *)((unaff_R15 - 0x30) + uVar50 * 4);
      local_5aa0 = *(float *)((unaff_R15 - 0x20) + uVar50 * 4);
      local_5ac0 = *(float *)((unaff_R15 - 0x10) + uVar50 * 4);
      local_5d10 = *(undefined8 *)(local_5da8 + 0xd0);
      uStack_5d08 = *(undefined8 *)(local_5da8 + 0xd8);
      local_5da0._0_4_ = local_5da0._4_4_;
      fStack_5d98 = (float)local_5da0._4_4_;
      fStack_5d94 = (float)local_5da0._4_4_;
      fStack_5d90 = (float)local_5da0._4_4_;
      fStack_5d8c = (float)local_5da0._4_4_;
      fStack_5d88 = (float)local_5da0._4_4_;
      fStack_5d84 = (float)local_5da0._4_4_;
      fVar77 = fVar108 - (float)local_5da0._4_4_;
      fStack_5a5c = local_5a60;
      fStack_5a58 = local_5a60;
      fStack_5a54 = local_5a60;
      fStack_5a50 = local_5a60;
      fStack_5a4c = local_5a60;
      fStack_5a48 = local_5a60;
      fStack_5a44 = local_5a60;
      fVar78 = fVar110 - local_5a60;
      local_5e40._4_4_ = fVar78;
      local_5e40._0_4_ = fVar78;
      local_5e40._8_4_ = fVar78;
      local_5e40._12_4_ = fVar78;
      local_5e40._16_4_ = fVar78;
      local_5e40._20_4_ = fVar78;
      local_5e40._24_4_ = fVar78;
      local_5e40._28_4_ = fVar78;
      fStack_5a7c = local_5a80;
      fStack_5a78 = local_5a80;
      fStack_5a74 = local_5a80;
      fStack_5a70 = local_5a80;
      fStack_5a6c = local_5a80;
      fStack_5a68 = local_5a80;
      fStack_5a64 = local_5a80;
      fVar108 = local_5a80 - fVar108;
      fVar73 = fVar78 * fVar108;
      auVar111._4_4_ = fVar108;
      auVar111._0_4_ = fVar108;
      auVar111._8_4_ = fVar108;
      auVar111._12_4_ = fVar108;
      auVar111._16_4_ = fVar108;
      auVar111._20_4_ = fVar108;
      auVar111._24_4_ = fVar108;
      auVar111._28_4_ = fVar108;
      local_5e60._4_4_ = fVar77;
      local_5e60._0_4_ = fVar77;
      local_5e60._8_4_ = fVar77;
      local_5e60._12_4_ = fVar77;
      local_5e60._16_4_ = fVar77;
      local_5e60._20_4_ = fVar77;
      local_5e60._24_4_ = fVar77;
      local_5e60._28_4_ = fVar77;
      fStack_5a9c = local_5aa0;
      fStack_5a98 = local_5aa0;
      fStack_5a94 = local_5aa0;
      fStack_5a90 = local_5aa0;
      fStack_5a8c = local_5aa0;
      fStack_5a88 = local_5aa0;
      fStack_5a84 = local_5aa0;
      fVar79 = local_5aa0 - fVar109;
      fVar108 = fVar77 * fVar79;
      auVar115._4_4_ = fVar79;
      auVar115._0_4_ = fVar79;
      auVar115._8_4_ = fVar79;
      auVar115._12_4_ = fVar79;
      auVar115._16_4_ = fVar79;
      auVar115._20_4_ = fVar79;
      auVar115._24_4_ = fVar79;
      auVar115._28_4_ = fVar79;
      local_5ce0._0_4_ = local_5ce0._4_4_;
      fStack_5cd8 = (float)local_5ce0._4_4_;
      fStack_5cd4 = (float)local_5ce0._4_4_;
      fStack_5cd0 = (float)local_5ce0._4_4_;
      fStack_5ccc = (float)local_5ce0._4_4_;
      fStack_5cc8 = (float)local_5ce0._4_4_;
      fStack_5cc4 = (float)local_5ce0._4_4_;
      fVar109 = fVar109 - (float)local_5ce0._4_4_;
      auVar103._4_4_ = fVar109;
      auVar103._0_4_ = fVar109;
      auVar103._8_4_ = fVar109;
      auVar103._12_4_ = fVar109;
      auVar103._16_4_ = fVar109;
      auVar103._20_4_ = fVar109;
      auVar103._24_4_ = fVar109;
      auVar103._28_4_ = fVar109;
      fStack_5abc = local_5ac0;
      fStack_5ab8 = local_5ac0;
      fStack_5ab4 = local_5ac0;
      fStack_5ab0 = local_5ac0;
      fStack_5aac = local_5ac0;
      fStack_5aa8 = local_5ac0;
      fStack_5aa4 = local_5ac0;
      fVar79 = local_5ac0 - fVar110;
      fVar109 = fVar109 * fVar79;
      auVar118._4_4_ = fVar79;
      auVar118._0_4_ = fVar79;
      auVar118._8_4_ = fVar79;
      auVar118._12_4_ = fVar79;
      auVar118._16_4_ = fVar79;
      auVar118._20_4_ = fVar79;
      auVar118._24_4_ = fVar79;
      auVar118._28_4_ = fVar79;
      auVar53._4_4_ = fVar109;
      auVar53._0_4_ = fVar109;
      auVar53._8_4_ = fVar109;
      auVar53._12_4_ = fVar109;
      auVar53._16_4_ = fVar109;
      auVar53._20_4_ = fVar109;
      auVar53._24_4_ = fVar109;
      auVar53._28_4_ = fVar109;
      auVar11 = vfmsub231ps_fma(auVar53,auVar115,local_5e40._0_32_);
      auVar61._4_4_ = fVar73;
      auVar61._0_4_ = fVar73;
      auVar61._8_4_ = fVar73;
      auVar61._12_4_ = fVar73;
      auVar61._16_4_ = fVar73;
      auVar61._20_4_ = fVar73;
      auVar61._24_4_ = fVar73;
      auVar61._28_4_ = fVar73;
      auVar12 = vfmsub231ps_fma(auVar61,auVar118,local_5e60);
      auVar67._4_4_ = fVar108;
      auVar67._0_4_ = fVar108;
      auVar67._8_4_ = fVar108;
      auVar67._12_4_ = fVar108;
      auVar67._16_4_ = fVar108;
      auVar67._20_4_ = fVar108;
      auVar67._24_4_ = fVar108;
      auVar67._28_4_ = fVar108;
      auVar75 = vsubps_avx(auVar83,*(undefined1 (*) [32])ray);
      auVar89 = ZEXT436(auVar75._28_4_);
      auVar80 = vsubps_avx(auVar90,*(undefined1 (*) [32])(ray + 0x20));
      auVar13 = vfmsub231ps_fma(auVar67,auVar111,auVar103);
      auVar81 = vsubps_avx(auVar95,*(undefined1 (*) [32])(ray + 0x40));
      auVar59 = *(undefined1 (*) [32])(ray + 0x80);
      auVar56 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar6._4_4_ = auVar59._4_4_ * auVar80._4_4_;
      auVar6._0_4_ = auVar59._0_4_ * auVar80._0_4_;
      auVar6._8_4_ = auVar59._8_4_ * auVar80._8_4_;
      auVar6._12_4_ = auVar59._12_4_ * auVar80._12_4_;
      auVar6._16_4_ = auVar59._16_4_ * auVar80._16_4_;
      auVar6._20_4_ = auVar59._20_4_ * auVar80._20_4_;
      auVar6._24_4_ = auVar59._24_4_ * auVar80._24_4_;
      auVar6._28_4_ = fVar110;
      auVar8 = vfmsub231ps_fma(auVar6,auVar75,auVar56);
      auVar74 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar7._4_4_ = auVar13._4_4_ * auVar74._4_4_;
      auVar7._0_4_ = auVar13._0_4_ * auVar74._0_4_;
      auVar7._8_4_ = auVar13._8_4_ * auVar74._8_4_;
      auVar7._12_4_ = auVar13._12_4_ * auVar74._12_4_;
      auVar7._16_4_ = auVar74._16_4_ * 0.0;
      auVar7._20_4_ = auVar74._20_4_ * 0.0;
      auVar7._24_4_ = auVar74._24_4_ * 0.0;
      auVar7._28_4_ = local_5ac0;
      auVar58 = vfmadd231ps_fma(auVar7,ZEXT1632(auVar12),auVar56);
      auVar14._4_4_ = auVar81._4_4_ * auVar56._4_4_;
      auVar14._0_4_ = auVar81._0_4_ * auVar56._0_4_;
      auVar14._8_4_ = auVar81._8_4_ * auVar56._8_4_;
      auVar14._12_4_ = auVar81._12_4_ * auVar56._12_4_;
      auVar14._16_4_ = auVar81._16_4_ * auVar56._16_4_;
      auVar14._20_4_ = auVar81._20_4_ * auVar56._20_4_;
      auVar14._24_4_ = auVar81._24_4_ * auVar56._24_4_;
      auVar14._28_4_ = fVar77;
      auVar9 = vfmsub231ps_fma(auVar14,auVar80,auVar74);
      auVar15._4_4_ = auVar74._4_4_ * auVar75._4_4_;
      auVar15._0_4_ = auVar74._0_4_ * auVar75._0_4_;
      auVar15._8_4_ = auVar74._8_4_ * auVar75._8_4_;
      auVar15._12_4_ = auVar74._12_4_ * auVar75._12_4_;
      auVar15._16_4_ = auVar74._16_4_ * auVar75._16_4_;
      auVar15._20_4_ = auVar74._20_4_ * auVar75._20_4_;
      auVar15._24_4_ = auVar74._24_4_ * auVar75._24_4_;
      auVar15._28_4_ = auVar56._28_4_;
      auVar10 = vfmsub231ps_fma(auVar15,auVar81,auVar59);
      auVar72 = (undefined1  [36])0x0;
      auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar11),auVar59);
      auVar16._4_4_ = fVar79 * auVar8._4_4_;
      auVar16._0_4_ = fVar79 * auVar8._0_4_;
      auVar16._8_4_ = fVar79 * auVar8._8_4_;
      auVar16._12_4_ = fVar79 * auVar8._12_4_;
      auVar16._16_4_ = fVar79 * 0.0;
      auVar16._20_4_ = fVar79 * 0.0;
      auVar16._24_4_ = fVar79 * 0.0;
      auVar16._28_4_ = auVar74._28_4_;
      auVar5 = vfmadd231ps_fma(auVar16,ZEXT1632(auVar10),auVar115);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar9),auVar111);
      local_5ae0._8_4_ = 0x80000000;
      local_5ae0._0_8_ = 0x8000000080000000;
      local_5ae0._12_4_ = 0x80000000;
      local_5ae0._16_4_ = 0x80000000;
      local_5ae0._20_4_ = 0x80000000;
      local_5ae0._24_4_ = 0x80000000;
      local_5ae0._28_4_ = 0x80000000;
      auVar59 = vandps_avx(ZEXT1632(auVar58),local_5ae0);
      uVar105 = auVar59._0_4_;
      auVar84._0_4_ = (float)(uVar105 ^ auVar5._0_4_);
      uVar106 = auVar59._4_4_;
      auVar84._4_4_ = (float)(uVar106 ^ auVar5._4_4_);
      uVar107 = auVar59._8_4_;
      auVar84._8_4_ = (float)(uVar107 ^ auVar5._8_4_);
      uVar113 = auVar59._12_4_;
      auVar84._12_4_ = (float)(uVar113 ^ auVar5._12_4_);
      fVar108 = auVar59._16_4_;
      auVar84._16_4_ = fVar108;
      fVar109 = auVar59._20_4_;
      auVar84._20_4_ = fVar109;
      fVar110 = auVar59._24_4_;
      auVar84._24_4_ = fVar110;
      uVar114 = auVar59._28_4_;
      auVar84._28_4_ = uVar114;
      auVar56 = vcmpps_avx(auVar84,_DAT_01faff00,5);
      auVar117 = ZEXT436(auVar56._28_4_);
      auVar74 = auVar69 & auVar56;
      local_5ea0._0_32_ = auVar69;
      uStack_5d3c = local_5d40;
      uStack_5d38 = local_5d40;
      uStack_5d34 = local_5d40;
      uStack_5d30 = local_5d40;
      uStack_5d2c = local_5d40;
      uStack_5d28 = local_5d40;
      uStack_5d24 = local_5d40;
      if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar74 >> 0x7f,0) != '\0') ||
            (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar74 >> 0xbf,0) != '\0') ||
          (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar74[0x1f] < '\0') {
        auVar56 = vandps_avx(auVar56,auVar69);
        uVar42 = auVar56._28_4_;
        auVar117 = ZEXT436(uVar42);
        auVar76._0_4_ = auVar8._0_4_ * fVar78;
        auVar76._4_4_ = auVar8._4_4_ * fVar78;
        auVar76._8_4_ = auVar8._8_4_ * fVar78;
        auVar76._12_4_ = auVar8._12_4_ * fVar78;
        auVar76._16_4_ = fVar78 * 0.0;
        auVar76._20_4_ = fVar78 * 0.0;
        auVar76._24_4_ = fVar78 * 0.0;
        auVar76._28_4_ = 0;
        auVar5 = vfmadd213ps_fma(auVar103,ZEXT1632(auVar10),auVar76);
        auVar5 = vfmadd213ps_fma(local_5e60,ZEXT1632(auVar9),ZEXT1632(auVar5));
        auVar96._0_4_ = (float)(uVar105 ^ auVar5._0_4_);
        auVar96._4_4_ = (float)(uVar106 ^ auVar5._4_4_);
        auVar96._8_4_ = (float)(uVar107 ^ auVar5._8_4_);
        auVar96._12_4_ = (float)(uVar113 ^ auVar5._12_4_);
        auVar96._16_4_ = fVar108;
        auVar96._20_4_ = fVar109;
        auVar96._24_4_ = fVar110;
        auVar96._28_4_ = uVar114;
        auVar74 = vcmpps_avx(auVar96,_DAT_01faff00,5);
        auVar72 = ZEXT436(auVar74._28_4_);
        auVar101 = auVar56 & auVar74;
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar101 >> 0x7f,0) != '\0') ||
              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar101 >> 0xbf,0) != '\0') ||
            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar101[0x1f] < '\0') {
          auVar101 = vandps_avx(ZEXT1632(auVar58),local_5ca0);
          auVar56 = vandps_avx(auVar56,auVar74);
          auVar72 = ZEXT436(auVar56._28_4_);
          auVar74 = vsubps_avx(auVar101,auVar84);
          auVar74 = vcmpps_avx(auVar74,auVar96,5);
          auVar102 = auVar56 & auVar74;
          if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar102 >> 0x7f,0) != '\0') ||
                (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0xbf,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar102[0x1f] < '\0') {
            local_5e60._0_8_ = uVar47;
            local_5e40._0_8_ = uVar45;
            auVar56 = vandps_avx(auVar74,auVar56);
            auVar72 = ZEXT436(auVar56._28_4_);
            auVar22._4_4_ = auVar81._4_4_ * auVar13._4_4_;
            auVar22._0_4_ = auVar81._0_4_ * auVar13._0_4_;
            auVar22._8_4_ = auVar81._8_4_ * auVar13._8_4_;
            auVar22._12_4_ = auVar81._12_4_ * auVar13._12_4_;
            auVar22._16_4_ = auVar81._16_4_ * 0.0;
            auVar22._20_4_ = auVar81._20_4_ * 0.0;
            auVar22._24_4_ = auVar81._24_4_ * 0.0;
            auVar22._28_4_ = auVar81._28_4_;
            auVar5 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar12),auVar22);
            auVar5 = vfmadd213ps_fma(auVar75,ZEXT1632(auVar11),ZEXT1632(auVar5));
            auVar87._0_4_ = (float)(uVar105 ^ auVar5._0_4_);
            auVar87._4_4_ = (float)(uVar106 ^ auVar5._4_4_);
            auVar87._8_4_ = (float)(uVar107 ^ auVar5._8_4_);
            auVar87._12_4_ = (float)(uVar113 ^ auVar5._12_4_);
            auVar87._16_4_ = fVar108;
            auVar87._20_4_ = fVar109;
            auVar87._24_4_ = fVar110;
            auVar87._28_4_ = uVar114;
            auVar89 = ZEXT436(uVar114);
            auVar91._0_4_ = auVar101._0_4_ * *(float *)(ray + 0x60);
            auVar91._4_4_ = auVar101._4_4_ * *(float *)(ray + 100);
            auVar91._8_4_ = auVar101._8_4_ * *(float *)(ray + 0x68);
            auVar91._12_4_ = auVar101._12_4_ * *(float *)(ray + 0x6c);
            auVar91._16_4_ = auVar101._16_4_ * *(float *)(ray + 0x70);
            auVar91._20_4_ = auVar101._20_4_ * *(float *)(ray + 0x74);
            auVar91._24_4_ = auVar101._24_4_ * *(float *)(ray + 0x78);
            auVar91._28_4_ = 0;
            auVar74 = vcmpps_avx(auVar91,auVar87,1);
            local_5cc0 = *(float *)(ray + 0x100);
            auVar80 = *(undefined1 (*) [32])(ray + 0x100);
            fStack_5cbc = *(float *)(ray + 0x104);
            fStack_5cb8 = *(float *)(ray + 0x108);
            fStack_5cb4 = *(float *)(ray + 0x10c);
            fStack_5cb0 = *(float *)(ray + 0x110);
            fStack_5cac = *(float *)(ray + 0x114);
            fStack_5ca8 = *(float *)(ray + 0x118);
            uStack_5ca4 = *(undefined4 *)(ray + 0x11c);
            auVar23._4_4_ = *(float *)(ray + 0x104) * auVar101._4_4_;
            auVar23._0_4_ = local_5cc0 * auVar101._0_4_;
            auVar23._8_4_ = *(float *)(ray + 0x108) * auVar101._8_4_;
            auVar23._12_4_ = *(float *)(ray + 0x10c) * auVar101._12_4_;
            auVar23._16_4_ = *(float *)(ray + 0x110) * auVar101._16_4_;
            auVar23._20_4_ = *(float *)(ray + 0x114) * auVar101._20_4_;
            auVar23._24_4_ = *(float *)(ray + 0x118) * auVar101._24_4_;
            auVar23._28_4_ = *(undefined4 *)(ray + 0x11c);
            auVar75 = vcmpps_avx(auVar87,auVar23,2);
            auVar74 = vandps_avx(auVar75,auVar74);
            auVar75 = auVar56 & auVar74;
            if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar75 >> 0x7f,0) != '\0') ||
                  (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar75 >> 0xbf,0) != '\0') ||
                (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar75[0x1f] < '\0') {
              auVar56 = vandps_avx(auVar74,auVar56);
              auVar72 = ZEXT436(auVar56._28_4_);
              auVar74 = vcmpps_avx(ZEXT1632(auVar58),_DAT_01faff00,4);
              auVar75 = auVar56 & auVar74;
              if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar75 >> 0x7f,0) != '\0') ||
                    (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar75 >> 0xbf,0) != '\0') ||
                  (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar75[0x1f] < '\0') {
                auVar56 = vandps_avx(auVar74,auVar56);
                auVar72 = ZEXT436(auVar56._28_4_);
                local_5e70 = (context->scene->geometries).items[uVar100].ptr;
                uVar105 = local_5e70->mask;
                auVar92._4_4_ = uVar105;
                auVar92._0_4_ = uVar105;
                auVar92._8_4_ = uVar105;
                auVar92._12_4_ = uVar105;
                auVar92._16_4_ = uVar105;
                auVar92._20_4_ = uVar105;
                auVar92._24_4_ = uVar105;
                auVar92._28_4_ = uVar105;
                auVar74 = vpand_avx2(auVar92,*(undefined1 (*) [32])(ray + 0x120));
                auVar75 = vpcmpeqd_avx2(auVar74,_DAT_01faff00);
                auVar74 = auVar56 & ~auVar75;
                if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar74 >> 0x7f,0) != '\0') ||
                      (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar74 >> 0xbf,0) != '\0') ||
                    (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar74[0x1f] < '\0') {
                  uVar51 = *(undefined4 *)((long)&local_5d10 + uVar50 * 4);
                  auVar69 = vandnps_avx(auVar75,auVar56);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (auVar89 = ZEXT436(uVar114), auVar117 = ZEXT436(uVar42),
                     local_5e70->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar74 = vrcpps_avx(auVar101);
                    auVar98._8_4_ = 0x3f800000;
                    auVar98._0_8_ = 0x3f8000003f800000;
                    auVar98._12_4_ = 0x3f800000;
                    auVar98._16_4_ = 0x3f800000;
                    auVar98._20_4_ = 0x3f800000;
                    auVar98._24_4_ = 0x3f800000;
                    auVar98._28_4_ = 0x3f800000;
                    auVar58 = vfnmadd213ps_fma(auVar101,auVar74,auVar98);
                    auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar74,auVar74);
                    fVar73 = auVar58._0_4_;
                    fVar77 = auVar58._4_4_;
                    auVar26._4_4_ = fVar77 * auVar84._4_4_;
                    auVar26._0_4_ = fVar73 * auVar84._0_4_;
                    fVar78 = auVar58._8_4_;
                    auVar26._8_4_ = fVar78 * auVar84._8_4_;
                    fVar79 = auVar58._12_4_;
                    auVar26._12_4_ = fVar79 * auVar84._12_4_;
                    auVar26._16_4_ = fVar108 * 0.0;
                    auVar26._20_4_ = fVar109 * 0.0;
                    auVar26._24_4_ = fVar110 * 0.0;
                    auVar26._28_4_ = uVar114;
                    auVar56 = vminps_avx(auVar26,auVar98);
                    auVar27._4_4_ = auVar96._4_4_ * fVar77;
                    auVar27._0_4_ = auVar96._0_4_ * fVar73;
                    auVar27._8_4_ = auVar96._8_4_ * fVar78;
                    auVar27._12_4_ = auVar96._12_4_ * fVar79;
                    auVar27._16_4_ = fVar108 * 0.0;
                    auVar27._20_4_ = fVar109 * 0.0;
                    auVar27._24_4_ = fVar110 * 0.0;
                    auVar27._28_4_ = auVar74._28_4_;
                    auVar74 = vminps_avx(auVar27,auVar98);
                    auVar75 = vsubps_avx(auVar98,auVar56);
                    auVar81 = vsubps_avx(auVar98,auVar74);
                    auVar34._8_8_ = uStack_5b18;
                    auVar34._0_8_ = local_5b20;
                    auVar34._16_8_ = uStack_5b10;
                    auVar34._24_8_ = uStack_5b08;
                    local_5c00 = vblendvps_avx(auVar56,auVar75,auVar34);
                    local_5be0 = vblendvps_avx(auVar74,auVar81,auVar34);
                    pRVar3 = context->user;
                    local_5ba0._4_4_ = uVar100;
                    local_5ba0._0_4_ = uVar100;
                    local_5ba0._8_4_ = uVar100;
                    local_5ba0._12_4_ = uVar100;
                    local_5ba0._16_4_ = uVar100;
                    local_5ba0._20_4_ = uVar100;
                    local_5ba0._24_4_ = uVar100;
                    local_5ba0._28_4_ = uVar100;
                    local_5bc0._4_4_ = uVar51;
                    local_5bc0._0_4_ = uVar51;
                    local_5bc0._8_4_ = uVar51;
                    local_5bc0._12_4_ = uVar51;
                    local_5bc0._16_4_ = uVar51;
                    local_5bc0._20_4_ = uVar51;
                    local_5bc0._24_4_ = uVar51;
                    local_5bc0._28_4_ = uVar51;
                    auVar56 = ZEXT1632(auVar11);
                    local_5c60[0] = (RTCHitN)auVar56[0];
                    local_5c60[1] = (RTCHitN)auVar56[1];
                    local_5c60[2] = (RTCHitN)auVar56[2];
                    local_5c60[3] = (RTCHitN)auVar56[3];
                    local_5c60[4] = (RTCHitN)auVar56[4];
                    local_5c60[5] = (RTCHitN)auVar56[5];
                    local_5c60[6] = (RTCHitN)auVar56[6];
                    local_5c60[7] = (RTCHitN)auVar56[7];
                    local_5c60[8] = (RTCHitN)auVar56[8];
                    local_5c60[9] = (RTCHitN)auVar56[9];
                    local_5c60[10] = (RTCHitN)auVar56[10];
                    local_5c60[0xb] = (RTCHitN)auVar56[0xb];
                    local_5c60[0xc] = (RTCHitN)auVar56[0xc];
                    local_5c60[0xd] = (RTCHitN)auVar56[0xd];
                    local_5c60[0xe] = (RTCHitN)auVar56[0xe];
                    local_5c60[0xf] = (RTCHitN)auVar56[0xf];
                    local_5c60[0x10] = (RTCHitN)auVar56[0x10];
                    local_5c60[0x11] = (RTCHitN)auVar56[0x11];
                    local_5c60[0x12] = (RTCHitN)auVar56[0x12];
                    local_5c60[0x13] = (RTCHitN)auVar56[0x13];
                    local_5c60[0x14] = (RTCHitN)auVar56[0x14];
                    local_5c60[0x15] = (RTCHitN)auVar56[0x15];
                    local_5c60[0x16] = (RTCHitN)auVar56[0x16];
                    local_5c60[0x17] = (RTCHitN)auVar56[0x17];
                    local_5c60[0x18] = (RTCHitN)auVar56[0x18];
                    local_5c60[0x19] = (RTCHitN)auVar56[0x19];
                    local_5c60[0x1a] = (RTCHitN)auVar56[0x1a];
                    local_5c60[0x1b] = (RTCHitN)auVar56[0x1b];
                    local_5c60[0x1c] = (RTCHitN)auVar56[0x1c];
                    local_5c60[0x1d] = (RTCHitN)auVar56[0x1d];
                    local_5c60[0x1e] = (RTCHitN)auVar56[0x1e];
                    local_5c60[0x1f] = (RTCHitN)auVar56[0x1f];
                    local_5c40 = ZEXT1632(auVar12);
                    local_5c20 = ZEXT1632(auVar13);
                    auVar56 = vpcmpeqd_avx2(auVar56,auVar56);
                    local_5e18[1] = auVar56;
                    *local_5e18 = auVar56;
                    local_5b80 = pRVar3->instID[0];
                    uStack_5b7c = local_5b80;
                    uStack_5b78 = local_5b80;
                    uStack_5b74 = local_5b80;
                    uStack_5b70 = local_5b80;
                    uStack_5b6c = local_5b80;
                    uStack_5b68 = local_5b80;
                    uStack_5b64 = local_5b80;
                    local_5b60 = pRVar3->instPrimID[0];
                    auVar62._0_4_ = fVar73 * auVar87._0_4_;
                    auVar62._4_4_ = fVar77 * auVar87._4_4_;
                    auVar62._8_4_ = fVar78 * auVar87._8_4_;
                    auVar62._12_4_ = fVar79 * auVar87._12_4_;
                    auVar62._16_4_ = fVar108 * 0.0;
                    auVar62._20_4_ = fVar109 * 0.0;
                    auVar62._24_4_ = fVar110 * 0.0;
                    auVar62._28_4_ = 0;
                    uStack_5b5c = local_5b60;
                    uStack_5b58 = local_5b60;
                    uStack_5b54 = local_5b60;
                    uStack_5b50 = local_5b60;
                    uStack_5b4c = local_5b60;
                    uStack_5b48 = local_5b60;
                    uStack_5b44 = local_5b60;
                    auVar56 = vblendvps_avx(auVar80,auVar62,auVar69);
                    *(undefined1 (*) [32])(ray + 0x100) = auVar56;
                    local_5e10.valid = (int *)local_5de0;
                    local_5e10.geometryUserPtr = local_5e70->userPtr;
                    local_5e10.context = context->user;
                    local_5e10.hit = local_5c60;
                    local_5e10.N = 8;
                    local_5e10.ray = (RTCRayN *)ray;
                    local_5de0 = auVar69;
                    auVar89 = ZEXT436(uVar114);
                    auVar117 = ZEXT436(uVar42);
                    if (local_5e70->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar89 = (undefined1  [36])0x0;
                      auVar59 = ZEXT1632(auVar59._0_16_);
                      auVar117 = (undefined1  [36])0x0;
                      (*local_5e70->occlusionFilterN)(&local_5e10);
                    }
                    auVar69 = vpcmpeqd_avx2(local_5de0,_DAT_01faff00);
                    auVar56 = _DAT_01fe9960 & ~auVar69;
                    if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar56 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar56 >> 0x7f,0) == '\0') &&
                          (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar56 >> 0xbf,0) == '\0') &&
                        (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar56[0x1f]) {
                      auVar69 = auVar69 ^ _DAT_01fe9960;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_5e70->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar89 = (undefined1  [36])0x0;
                        auVar59 = ZEXT1632(auVar59._0_16_);
                        auVar117 = (undefined1  [36])0x0;
                        (*p_Var4)(&local_5e10);
                      }
                      auVar56 = vpcmpeqd_avx2(local_5de0,_DAT_01faff00);
                      auVar69 = auVar56 ^ _DAT_01fe9960;
                      auVar63._8_4_ = 0xff800000;
                      auVar63._0_8_ = 0xff800000ff800000;
                      auVar63._12_4_ = 0xff800000;
                      auVar63._16_4_ = 0xff800000;
                      auVar63._20_4_ = 0xff800000;
                      auVar63._24_4_ = 0xff800000;
                      auVar63._28_4_ = 0xff800000;
                      auVar56 = vblendvps_avx(auVar63,*(undefined1 (*) [32])(local_5e10.ray + 0x100)
                                              ,auVar56);
                      *(undefined1 (*) [32])(local_5e10.ray + 0x100) = auVar56;
                    }
                    auVar32._4_4_ = fStack_5cbc;
                    auVar32._0_4_ = local_5cc0;
                    auVar32._8_4_ = fStack_5cb8;
                    auVar32._12_4_ = fStack_5cb4;
                    auVar32._16_4_ = fStack_5cb0;
                    auVar32._20_4_ = fStack_5cac;
                    auVar32._24_4_ = fStack_5ca8;
                    auVar32._28_4_ = uStack_5ca4;
                    auVar56 = vblendvps_avx(auVar32,*(undefined1 (*) [32])local_5e68,auVar69);
                    *(undefined1 (*) [32])local_5e68 = auVar56;
                  }
                  auVar72 = ZEXT436(auVar69._28_4_);
                  auVar69 = vandnps_avx(auVar69,local_5ea0._0_32_);
                  uVar45 = local_5e40._0_8_;
                  uVar47 = local_5e60._0_8_;
                }
              }
            }
          }
        }
      }
      if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar69 >> 0x7f,0) == '\0') &&
            (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar69 >> 0xbf,0) == '\0') &&
          (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar69[0x1f])
      {
        auVar104 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar59 = vpcmpeqd_avx2(auVar59,auVar59);
        auVar112 = ZEXT3264(auVar59);
        break;
      }
      auVar37._4_4_ = fStack_5a7c;
      auVar37._0_4_ = local_5a80;
      auVar37._8_4_ = fStack_5a78;
      auVar37._12_4_ = fStack_5a74;
      auVar37._16_4_ = fStack_5a70;
      auVar37._20_4_ = fStack_5a6c;
      auVar37._24_4_ = fStack_5a68;
      auVar37._28_4_ = fStack_5a64;
      auVar75 = vsubps_avx(local_5d80,auVar37);
      auVar36._4_4_ = fStack_5a9c;
      auVar36._0_4_ = local_5aa0;
      auVar36._8_4_ = fStack_5a98;
      auVar36._12_4_ = fStack_5a94;
      auVar36._16_4_ = fStack_5a90;
      auVar36._20_4_ = fStack_5a8c;
      auVar36._24_4_ = fStack_5a88;
      auVar36._28_4_ = fStack_5a84;
      auVar80 = vsubps_avx(local_5d00,auVar36);
      auVar31._4_4_ = uStack_5d3c;
      auVar31._0_4_ = local_5d40;
      auVar31._8_4_ = uStack_5d38;
      auVar31._12_4_ = uStack_5d34;
      auVar31._16_4_ = uStack_5d30;
      auVar31._20_4_ = uStack_5d2c;
      auVar31._24_4_ = uStack_5d28;
      auVar31._28_4_ = uStack_5d24;
      auVar35._4_4_ = fStack_5abc;
      auVar35._0_4_ = local_5ac0;
      auVar35._8_4_ = fStack_5ab8;
      auVar35._12_4_ = fStack_5ab4;
      auVar35._16_4_ = fStack_5ab0;
      auVar35._20_4_ = fStack_5aac;
      auVar35._24_4_ = fStack_5aa8;
      auVar35._28_4_ = fStack_5aa4;
      auVar81 = vsubps_avx(auVar31,auVar35);
      auVar101 = vsubps_avx(_local_5da0,local_5d80);
      auVar102 = vsubps_avx(_local_5ce0,local_5d00);
      auVar38._4_4_ = fStack_5a5c;
      auVar38._0_4_ = local_5a60;
      auVar38._8_4_ = fStack_5a58;
      auVar38._12_4_ = fStack_5a54;
      auVar38._16_4_ = fStack_5a50;
      auVar38._20_4_ = fStack_5a4c;
      auVar38._24_4_ = fStack_5a48;
      auVar38._28_4_ = fStack_5a44;
      auVar57 = vsubps_avx(auVar38,auVar31);
      auVar17._4_4_ = auVar57._4_4_ * auVar80._4_4_;
      auVar17._0_4_ = auVar57._0_4_ * auVar80._0_4_;
      auVar17._8_4_ = auVar57._8_4_ * auVar80._8_4_;
      auVar17._12_4_ = auVar57._12_4_ * auVar80._12_4_;
      auVar17._16_4_ = auVar57._16_4_ * auVar80._16_4_;
      auVar17._20_4_ = auVar57._20_4_ * auVar80._20_4_;
      auVar17._24_4_ = auVar57._24_4_ * auVar80._24_4_;
      auVar17._28_4_ = fStack_5a44;
      auVar11 = vfmsub231ps_fma(auVar17,auVar102,auVar81);
      auVar104._0_4_ = auVar81._0_4_ * auVar101._0_4_;
      auVar104._4_4_ = auVar81._4_4_ * auVar101._4_4_;
      auVar104._8_4_ = auVar81._8_4_ * auVar101._8_4_;
      auVar104._12_4_ = auVar81._12_4_ * auVar101._12_4_;
      auVar104._16_4_ = auVar81._16_4_ * auVar101._16_4_;
      auVar104._20_4_ = auVar81._20_4_ * auVar101._20_4_;
      auVar104._24_4_ = auVar81._24_4_ * auVar101._24_4_;
      auVar104._28_36_ = auVar72;
      auVar12 = vfmsub231ps_fma(auVar104._0_32_,auVar57,auVar75);
      auVar112._0_4_ = auVar102._0_4_ * auVar75._0_4_;
      auVar112._4_4_ = auVar102._4_4_ * auVar75._4_4_;
      auVar112._8_4_ = auVar102._8_4_ * auVar75._8_4_;
      auVar112._12_4_ = auVar102._12_4_ * auVar75._12_4_;
      auVar112._16_4_ = auVar102._16_4_ * auVar75._16_4_;
      auVar112._20_4_ = auVar102._20_4_ * auVar75._20_4_;
      auVar112._24_4_ = auVar102._24_4_ * auVar75._24_4_;
      auVar112._28_36_ = auVar89;
      _local_5ce0 = auVar80;
      auVar13 = vfmsub231ps_fma(auVar112._0_32_,auVar101,auVar80);
      auVar60 = vsubps_avx(local_5d80,*(undefined1 (*) [32])ray);
      auVar6 = vsubps_avx(local_5d00,*(undefined1 (*) [32])(ray + 0x20));
      auVar7 = vsubps_avx(auVar31,*(undefined1 (*) [32])(ray + 0x40));
      auVar59 = *(undefined1 (*) [32])(ray + 0x80);
      auVar56 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar116._0_4_ = auVar59._0_4_ * auVar6._0_4_;
      auVar116._4_4_ = auVar59._4_4_ * auVar6._4_4_;
      auVar116._8_4_ = auVar59._8_4_ * auVar6._8_4_;
      auVar116._12_4_ = auVar59._12_4_ * auVar6._12_4_;
      auVar116._16_4_ = auVar59._16_4_ * auVar6._16_4_;
      auVar116._20_4_ = auVar59._20_4_ * auVar6._20_4_;
      auVar116._24_4_ = auVar59._24_4_ * auVar6._24_4_;
      auVar116._28_36_ = auVar117;
      auVar8 = vfmsub231ps_fma(auVar116._0_32_,auVar60,auVar56);
      auVar74 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar18._4_4_ = auVar74._4_4_ * auVar13._4_4_;
      auVar18._0_4_ = auVar74._0_4_ * auVar13._0_4_;
      auVar18._8_4_ = auVar74._8_4_ * auVar13._8_4_;
      auVar18._12_4_ = auVar74._12_4_ * auVar13._12_4_;
      auVar18._16_4_ = auVar74._16_4_ * 0.0;
      auVar18._20_4_ = auVar74._20_4_ * 0.0;
      auVar18._24_4_ = auVar74._24_4_ * 0.0;
      auVar18._28_4_ = uStack_5d24;
      local_5d80 = ZEXT1632(auVar12);
      auVar58 = vfmadd231ps_fma(auVar18,local_5d80,auVar56);
      auVar19._4_4_ = auVar56._4_4_ * auVar7._4_4_;
      auVar19._0_4_ = auVar56._0_4_ * auVar7._0_4_;
      auVar19._8_4_ = auVar56._8_4_ * auVar7._8_4_;
      auVar19._12_4_ = auVar56._12_4_ * auVar7._12_4_;
      auVar19._16_4_ = auVar56._16_4_ * auVar7._16_4_;
      auVar19._20_4_ = auVar56._20_4_ * auVar7._20_4_;
      auVar19._24_4_ = auVar56._24_4_ * auVar7._24_4_;
      auVar19._28_4_ = auVar56._28_4_;
      auVar9 = vfmsub231ps_fma(auVar19,auVar6,auVar74);
      auVar20._4_4_ = auVar74._4_4_ * auVar60._4_4_;
      auVar20._0_4_ = auVar74._0_4_ * auVar60._0_4_;
      auVar20._8_4_ = auVar74._8_4_ * auVar60._8_4_;
      auVar20._12_4_ = auVar74._12_4_ * auVar60._12_4_;
      auVar20._16_4_ = auVar74._16_4_ * auVar60._16_4_;
      auVar20._20_4_ = auVar74._20_4_ * auVar60._20_4_;
      auVar20._24_4_ = auVar74._24_4_ * auVar60._24_4_;
      auVar20._28_4_ = auVar74._28_4_;
      auVar10 = vfmsub231ps_fma(auVar20,auVar7,auVar59);
      auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),ZEXT1632(auVar11),auVar59);
      auVar21._4_4_ = auVar57._4_4_ * auVar8._4_4_;
      auVar21._0_4_ = auVar57._0_4_ * auVar8._0_4_;
      auVar21._8_4_ = auVar57._8_4_ * auVar8._8_4_;
      auVar21._12_4_ = auVar57._12_4_ * auVar8._12_4_;
      auVar21._16_4_ = auVar57._16_4_ * 0.0;
      auVar21._20_4_ = auVar57._20_4_ * 0.0;
      auVar21._24_4_ = auVar57._24_4_ * 0.0;
      auVar21._28_4_ = auVar59._28_4_;
      auVar5 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar10),auVar102);
      auVar59 = vandps_avx(ZEXT1632(auVar58),local_5ae0);
      auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),ZEXT1632(auVar9),auVar101);
      uVar100 = auVar59._0_4_;
      auVar85._0_4_ = (float)(uVar100 ^ auVar5._0_4_);
      uVar105 = auVar59._4_4_;
      auVar85._4_4_ = (float)(uVar105 ^ auVar5._4_4_);
      uVar106 = auVar59._8_4_;
      auVar85._8_4_ = (float)(uVar106 ^ auVar5._8_4_);
      uVar107 = auVar59._12_4_;
      auVar85._12_4_ = (float)(uVar107 ^ auVar5._12_4_);
      fVar108 = auVar59._16_4_;
      auVar85._16_4_ = fVar108;
      fVar109 = auVar59._20_4_;
      auVar85._20_4_ = fVar109;
      fVar110 = auVar59._24_4_;
      auVar85._24_4_ = fVar110;
      uVar51 = auVar59._28_4_;
      auVar85._28_4_ = uVar51;
      auVar59 = vcmpps_avx(auVar85,_DAT_01faff00,5);
      auVar56 = auVar69 & auVar59;
      bVar52 = true;
      local_5ea0._0_32_ = auVar69;
      _local_5da0 = auVar75;
      if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar56 >> 0x7f,0) != '\0') ||
            (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar56 >> 0xbf,0) != '\0') ||
          (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar56[0x1f] < '\0') {
        local_5d00 = ZEXT1632(auVar13);
        auVar59 = vandps_avx(auVar59,auVar69);
        auVar54._0_4_ = auVar81._0_4_ * auVar8._0_4_;
        auVar54._4_4_ = auVar81._4_4_ * auVar8._4_4_;
        auVar54._8_4_ = auVar81._8_4_ * auVar8._8_4_;
        auVar54._12_4_ = auVar81._12_4_ * auVar8._12_4_;
        auVar54._16_4_ = auVar81._16_4_ * 0.0;
        auVar54._20_4_ = auVar81._20_4_ * 0.0;
        auVar54._24_4_ = auVar81._24_4_ * 0.0;
        auVar54._28_4_ = 0;
        auVar5 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar10),auVar54);
        auVar5 = vfmadd213ps_fma(auVar75,ZEXT1632(auVar9),ZEXT1632(auVar5));
        auVar93._0_4_ = (float)(uVar100 ^ auVar5._0_4_);
        auVar93._4_4_ = (float)(uVar105 ^ auVar5._4_4_);
        auVar93._8_4_ = (float)(uVar106 ^ auVar5._8_4_);
        auVar93._12_4_ = (float)(uVar107 ^ auVar5._12_4_);
        auVar93._16_4_ = fVar108;
        auVar93._20_4_ = fVar109;
        auVar93._24_4_ = fVar110;
        auVar93._28_4_ = uVar51;
        auVar56 = vcmpps_avx(auVar93,_DAT_01faff00,5);
        auVar74 = auVar59 & auVar56;
        if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar74 >> 0x7f,0) != '\0') ||
              (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar74 >> 0xbf,0) != '\0') ||
            (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar74[0x1f] < '\0') {
          auVar74 = vandps_avx(ZEXT1632(auVar58),local_5ca0);
          auVar56 = vandps_avx(auVar56,auVar59);
          auVar75 = vsubps_avx(auVar74,auVar85);
          auVar59 = vcmpps_avx(auVar75,auVar93,5);
          auVar80 = auVar56 & auVar59;
          if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar80 >> 0x7f,0) != '\0') ||
                (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar80 >> 0xbf,0) != '\0') ||
              (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar80[0x1f] < '\0') {
            local_5e60._0_8_ = uVar47;
            local_5e40._0_8_ = uVar45;
            auVar56 = vandps_avx(auVar59,auVar56);
            auVar24._4_4_ = auVar7._4_4_ * auVar13._4_4_;
            auVar24._0_4_ = auVar7._0_4_ * auVar13._0_4_;
            auVar24._8_4_ = auVar7._8_4_ * auVar13._8_4_;
            auVar24._12_4_ = auVar7._12_4_ * auVar13._12_4_;
            auVar24._16_4_ = auVar7._16_4_ * 0.0;
            auVar24._20_4_ = auVar7._20_4_ * 0.0;
            auVar24._24_4_ = auVar7._24_4_ * 0.0;
            auVar24._28_4_ = auVar75._28_4_;
            auVar5 = vfmadd132ps_fma(auVar6,auVar24,local_5d80);
            auVar5 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar11),ZEXT1632(auVar5));
            auVar88._0_4_ = (float)(uVar100 ^ auVar5._0_4_);
            auVar88._4_4_ = (float)(uVar105 ^ auVar5._4_4_);
            auVar88._8_4_ = (float)(uVar106 ^ auVar5._8_4_);
            auVar88._12_4_ = (float)(uVar107 ^ auVar5._12_4_);
            auVar88._16_4_ = fVar108;
            auVar88._20_4_ = fVar109;
            auVar88._24_4_ = fVar110;
            auVar88._28_4_ = uVar51;
            auVar25._4_4_ = auVar74._4_4_ * *(float *)(ray + 100);
            auVar25._0_4_ = auVar74._0_4_ * *(float *)(ray + 0x60);
            auVar25._8_4_ = auVar74._8_4_ * *(float *)(ray + 0x68);
            auVar25._12_4_ = auVar74._12_4_ * *(float *)(ray + 0x6c);
            auVar25._16_4_ = auVar74._16_4_ * *(float *)(ray + 0x70);
            auVar25._20_4_ = auVar74._20_4_ * *(float *)(ray + 0x74);
            auVar25._24_4_ = auVar74._24_4_ * *(float *)(ray + 0x78);
            auVar25._28_4_ = auVar75._28_4_;
            auVar75 = vcmpps_avx(auVar25,auVar88,1);
            _local_5da0 = *(undefined1 (*) [32])(ray + 0x100);
            auVar71._0_4_ = auVar74._0_4_ * *(float *)(ray + 0x100);
            auVar71._4_4_ = auVar74._4_4_ * *(float *)(ray + 0x104);
            auVar71._8_4_ = auVar74._8_4_ * *(float *)(ray + 0x108);
            auVar71._12_4_ = auVar74._12_4_ * *(float *)(ray + 0x10c);
            auVar71._16_4_ = auVar74._16_4_ * *(float *)(ray + 0x110);
            auVar71._20_4_ = auVar74._20_4_ * *(float *)(ray + 0x114);
            auVar71._24_4_ = auVar74._24_4_ * *(float *)(ray + 0x118);
            auVar71._28_4_ = 0;
            auVar80 = vcmpps_avx(auVar88,auVar71,2);
            auVar75 = vandps_avx(auVar80,auVar75);
            auVar80 = auVar56 & auVar75;
            if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar80 >> 0x7f,0) != '\0') ||
                  (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar80 >> 0xbf,0) != '\0') ||
                (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar80[0x1f] < '\0') {
              auVar56 = vandps_avx(auVar56,auVar75);
              auVar75 = vcmpps_avx(ZEXT1632(auVar58),_DAT_01faff00,4);
              auVar80 = auVar56 & auVar75;
              if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar80 >> 0x7f,0) != '\0') ||
                    (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar80 >> 0xbf,0) != '\0') ||
                  (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar80[0x1f] < '\0') {
                auVar56 = vandps_avx(auVar75,auVar56);
                uVar105 = *(uint *)(unaff_R15 + uVar50 * 4);
                pGVar2 = (context->scene->geometries).items[uVar105].ptr;
                local_5d40 = SUB84(pGVar2,0);
                uStack_5d3c = (undefined4)((ulong)pGVar2 >> 0x20);
                uVar100 = pGVar2->mask;
                auVar55._4_4_ = uVar100;
                auVar55._0_4_ = uVar100;
                auVar55._8_4_ = uVar100;
                auVar55._12_4_ = uVar100;
                auVar55._16_4_ = uVar100;
                auVar55._20_4_ = uVar100;
                auVar55._24_4_ = uVar100;
                auVar55._28_4_ = uVar100;
                auVar75 = vpand_avx2(auVar55,*(undefined1 (*) [32])(ray + 0x120));
                auVar80 = vpcmpeqd_avx2(auVar75,_DAT_01faff00);
                auVar75 = auVar56 & ~auVar80;
                if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar75 >> 0x7f,0) != '\0') ||
                      (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar75 >> 0xbf,0) != '\0') ||
                    (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar75[0x1f] < '\0') {
                  uVar1 = *(undefined4 *)((long)&local_5d10 + uVar50 * 4);
                  auVar69 = vandnps_avx(auVar80,auVar56);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar56 = vrcpps_avx(auVar74);
                    auVar97._8_4_ = 0x3f800000;
                    auVar97._0_8_ = 0x3f8000003f800000;
                    auVar97._12_4_ = 0x3f800000;
                    auVar97._16_4_ = 0x3f800000;
                    auVar97._20_4_ = 0x3f800000;
                    auVar97._24_4_ = 0x3f800000;
                    auVar97._28_4_ = 0x3f800000;
                    auVar58 = vfnmadd213ps_fma(auVar74,auVar56,auVar97);
                    auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar56,auVar56);
                    fVar73 = auVar58._0_4_;
                    fVar77 = auVar58._4_4_;
                    auVar28._4_4_ = fVar77 * auVar85._4_4_;
                    auVar28._0_4_ = fVar73 * auVar85._0_4_;
                    fVar78 = auVar58._8_4_;
                    auVar28._8_4_ = fVar78 * auVar85._8_4_;
                    fVar79 = auVar58._12_4_;
                    auVar28._12_4_ = fVar79 * auVar85._12_4_;
                    auVar28._16_4_ = fVar108 * 0.0;
                    auVar28._20_4_ = fVar109 * 0.0;
                    auVar28._24_4_ = fVar110 * 0.0;
                    auVar28._28_4_ = auVar56._28_4_;
                    auVar56 = vminps_avx(auVar28,auVar97);
                    auVar29._4_4_ = fVar77 * auVar93._4_4_;
                    auVar29._0_4_ = fVar73 * auVar93._0_4_;
                    auVar29._8_4_ = fVar78 * auVar93._8_4_;
                    auVar29._12_4_ = fVar79 * auVar93._12_4_;
                    auVar29._16_4_ = fVar108 * 0.0;
                    auVar29._20_4_ = fVar109 * 0.0;
                    auVar29._24_4_ = fVar110 * 0.0;
                    auVar29._28_4_ = uVar51;
                    auVar74 = vminps_avx(auVar29,auVar97);
                    auVar75 = vsubps_avx(auVar97,auVar56);
                    auVar80 = vsubps_avx(auVar97,auVar74);
                    auVar33._8_8_ = uStack_5b38;
                    auVar33._0_8_ = local_5b40;
                    auVar33._16_8_ = uStack_5b30;
                    auVar33._24_8_ = uStack_5b28;
                    local_5c00 = vblendvps_avx(auVar56,auVar75,auVar33);
                    local_5be0 = vblendvps_avx(auVar74,auVar80,auVar33);
                    pRVar3 = context->user;
                    local_5ba0._4_4_ = uVar105;
                    local_5ba0._0_4_ = uVar105;
                    local_5ba0._8_4_ = uVar105;
                    local_5ba0._12_4_ = uVar105;
                    local_5ba0._16_4_ = uVar105;
                    local_5ba0._20_4_ = uVar105;
                    local_5ba0._24_4_ = uVar105;
                    local_5ba0._28_4_ = uVar105;
                    local_5bc0._4_4_ = uVar1;
                    local_5bc0._0_4_ = uVar1;
                    local_5bc0._8_4_ = uVar1;
                    local_5bc0._12_4_ = uVar1;
                    local_5bc0._16_4_ = uVar1;
                    local_5bc0._20_4_ = uVar1;
                    local_5bc0._24_4_ = uVar1;
                    local_5bc0._28_4_ = uVar1;
                    auVar56 = ZEXT1632(auVar11);
                    local_5c60[0] = (RTCHitN)auVar56[0];
                    local_5c60[1] = (RTCHitN)auVar56[1];
                    local_5c60[2] = (RTCHitN)auVar56[2];
                    local_5c60[3] = (RTCHitN)auVar56[3];
                    local_5c60[4] = (RTCHitN)auVar56[4];
                    local_5c60[5] = (RTCHitN)auVar56[5];
                    local_5c60[6] = (RTCHitN)auVar56[6];
                    local_5c60[7] = (RTCHitN)auVar56[7];
                    local_5c60[8] = (RTCHitN)auVar56[8];
                    local_5c60[9] = (RTCHitN)auVar56[9];
                    local_5c60[10] = (RTCHitN)auVar56[10];
                    local_5c60[0xb] = (RTCHitN)auVar56[0xb];
                    local_5c60[0xc] = (RTCHitN)auVar56[0xc];
                    local_5c60[0xd] = (RTCHitN)auVar56[0xd];
                    local_5c60[0xe] = (RTCHitN)auVar56[0xe];
                    local_5c60[0xf] = (RTCHitN)auVar56[0xf];
                    local_5c60[0x10] = (RTCHitN)auVar56[0x10];
                    local_5c60[0x11] = (RTCHitN)auVar56[0x11];
                    local_5c60[0x12] = (RTCHitN)auVar56[0x12];
                    local_5c60[0x13] = (RTCHitN)auVar56[0x13];
                    local_5c60[0x14] = (RTCHitN)auVar56[0x14];
                    local_5c60[0x15] = (RTCHitN)auVar56[0x15];
                    local_5c60[0x16] = (RTCHitN)auVar56[0x16];
                    local_5c60[0x17] = (RTCHitN)auVar56[0x17];
                    local_5c60[0x18] = (RTCHitN)auVar56[0x18];
                    local_5c60[0x19] = (RTCHitN)auVar56[0x19];
                    local_5c60[0x1a] = (RTCHitN)auVar56[0x1a];
                    local_5c60[0x1b] = (RTCHitN)auVar56[0x1b];
                    local_5c60[0x1c] = (RTCHitN)auVar56[0x1c];
                    local_5c60[0x1d] = (RTCHitN)auVar56[0x1d];
                    local_5c60[0x1e] = (RTCHitN)auVar56[0x1e];
                    local_5c60[0x1f] = (RTCHitN)auVar56[0x1f];
                    local_5c40 = ZEXT1632(auVar12);
                    local_5c20 = ZEXT1632(auVar13);
                    auVar56 = vpcmpeqd_avx2(local_5c00,local_5c00);
                    local_5e18[1] = auVar56;
                    *local_5e18 = auVar56;
                    local_5b80 = pRVar3->instID[0];
                    uStack_5b7c = local_5b80;
                    uStack_5b78 = local_5b80;
                    uStack_5b74 = local_5b80;
                    uStack_5b70 = local_5b80;
                    uStack_5b6c = local_5b80;
                    uStack_5b68 = local_5b80;
                    uStack_5b64 = local_5b80;
                    local_5b60 = pRVar3->instPrimID[0];
                    auVar30._4_4_ = fVar77 * auVar88._4_4_;
                    auVar30._0_4_ = fVar73 * auVar88._0_4_;
                    auVar30._8_4_ = fVar78 * auVar88._8_4_;
                    auVar30._12_4_ = fVar79 * auVar88._12_4_;
                    auVar30._16_4_ = fVar108 * 0.0;
                    auVar30._20_4_ = fVar109 * 0.0;
                    auVar30._24_4_ = fVar110 * 0.0;
                    auVar30._28_4_ = 0;
                    uStack_5b5c = local_5b60;
                    uStack_5b58 = local_5b60;
                    uStack_5b54 = local_5b60;
                    uStack_5b50 = local_5b60;
                    uStack_5b4c = local_5b60;
                    uStack_5b48 = local_5b60;
                    uStack_5b44 = local_5b60;
                    auVar56 = vblendvps_avx(_local_5da0,auVar30,auVar69);
                    *(undefined1 (*) [32])(ray + 0x100) = auVar56;
                    local_5e10.valid = (int *)local_5de0;
                    local_5e10.geometryUserPtr = pGVar2->userPtr;
                    local_5e10.context = context->user;
                    local_5e10.hit = local_5c60;
                    local_5e10.N = 8;
                    local_5e10.ray = (RTCRayN *)ray;
                    local_5de0 = auVar69;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar59 = ZEXT1632(auVar59._0_16_);
                      (*pGVar2->occlusionFilterN)(&local_5e10);
                    }
                    auVar69 = vpcmpeqd_avx2(local_5de0,_DAT_01faff00);
                    auVar56 = _DAT_01fe9960 & ~auVar69;
                    if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar56 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar56 >> 0x7f,0) == '\0') &&
                          (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar56 >> 0xbf,0) == '\0') &&
                        (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar56[0x1f]) {
                      auVar69 = auVar69 ^ _DAT_01fe9960;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(CONCAT44(uStack_5d3c,local_5d40) + 0x3e) & 0x40) != 0)))) {
                        auVar59 = ZEXT1632(auVar59._0_16_);
                        (*p_Var4)(&local_5e10);
                      }
                      auVar56 = vpcmpeqd_avx2(local_5de0,_DAT_01faff00);
                      auVar69 = auVar56 ^ _DAT_01fe9960;
                      auVar64._8_4_ = 0xff800000;
                      auVar64._0_8_ = 0xff800000ff800000;
                      auVar64._12_4_ = 0xff800000;
                      auVar64._16_4_ = 0xff800000;
                      auVar64._20_4_ = 0xff800000;
                      auVar64._24_4_ = 0xff800000;
                      auVar64._28_4_ = 0xff800000;
                      auVar56 = vblendvps_avx(auVar64,*(undefined1 (*) [32])(local_5e10.ray + 0x100)
                                              ,auVar56);
                      *(undefined1 (*) [32])(local_5e10.ray + 0x100) = auVar56;
                    }
                    auVar56 = vblendvps_avx(_local_5da0,*(undefined1 (*) [32])local_5e68,auVar69);
                    *(undefined1 (*) [32])local_5e68 = auVar56;
                  }
                  auVar56 = local_5ea0._0_32_ & ~auVar69;
                  auVar69 = vandnps_avx(auVar69,local_5ea0._0_32_);
                  bVar52 = (((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                || (auVar56 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                               (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || SUB321(auVar56 >> 0x7f,0) != '\0') ||
                             (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            SUB321(auVar56 >> 0xbf,0) != '\0') ||
                           (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           auVar56[0x1f] < '\0';
                  uVar45 = local_5e40._0_8_;
                  uVar47 = local_5e60._0_8_;
                }
              }
            }
          }
        }
      }
      auVar104 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar59 = vpcmpeqd_avx2(auVar59,auVar59);
      auVar112 = ZEXT3264(auVar59);
      if ((!bVar52) || (bVar52 = 2 < uVar50, uVar50 = uVar50 + 1, bVar52)) break;
    }
    auVar60 = vandps_avx(auVar69,local_5c80);
    auVar69 = local_5c80 & auVar69;
    if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar69 >> 0x7f,0) == '\0') &&
          (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar69 >> 0xbf,0) == '\0') &&
        (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar69[0x1f])
    break;
  }
  auVar57._0_4_ = auVar112._0_4_ ^ auVar60._0_4_;
  auVar57._4_4_ = auVar112._4_4_ ^ auVar60._4_4_;
  auVar57._8_4_ = auVar112._8_4_ ^ auVar60._8_4_;
  auVar57._12_4_ = auVar112._12_4_ ^ auVar60._12_4_;
  auVar57._16_4_ = auVar112._16_4_ ^ auVar60._16_4_;
  auVar57._20_4_ = auVar112._20_4_ ^ auVar60._20_4_;
  auVar57._24_4_ = auVar112._24_4_ ^ auVar60._24_4_;
  auVar57._28_4_ = auVar112._28_4_ ^ auVar60._28_4_;
LAB_0060495a:
  local_5d60 = vorps_avx(local_5d60,auVar57);
  auVar69 = auVar112._0_32_ & ~local_5d60;
  if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar69 >> 0x7f,0) == '\0') &&
        (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar69 >> 0xbf,0) == '\0') &&
      (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar69[0x1f])
  goto LAB_00604a7d;
  auVar68._8_4_ = 0xff800000;
  auVar68._0_8_ = 0xff800000ff800000;
  auVar68._12_4_ = 0xff800000;
  auVar68._16_4_ = 0xff800000;
  auVar68._20_4_ = 0xff800000;
  auVar68._24_4_ = 0xff800000;
  auVar68._28_4_ = 0xff800000;
  local_5840 = vblendvps_avx(local_5840,auVar68,local_5d60);
  goto LAB_00603b6c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }